

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[2],kj::Repeat<char>&>
          (String *__return_storage_ptr__,kj *this,char (*params) [2],Repeat<char> *params_1)

{
  char (*value) [2];
  Repeat<char> *value_00;
  Repeat<char> RVar1;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  Repeat<char> *local_20;
  Repeat<char> *params_local_1;
  char (*params_local) [2];
  
  local_20 = (Repeat<char> *)params;
  params_local_1 = (Repeat<char> *)this;
  params_local = (char (*) [2])__return_storage_ptr__;
  value = ::const((char (*) [2])this);
  local_30 = toCharSequence<char_const(&)[2]>(value);
  value_00 = fwd<kj::Repeat<char>&>(local_20);
  RVar1 = toCharSequence<kj::Repeat<char>&>(value_00);
  local_40.size_ = RVar1.count;
  local_40.ptr._0_1_ = RVar1.value;
  _::concat<kj::ArrayPtr<char_const>,kj::Repeat<char>>
            (__return_storage_ptr__,(_ *)&local_30,&local_40,params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}